

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall Lodtalk::GarbageCollector::internalPerformCollection(GarbageCollector *this)

{
  _Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_> _Stack_28;
  
  if (0 < this->disableCount) {
    return;
  }
  StackMemories::getAll
            ((vector<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_> *)&_Stack_28,
             this->memoryManager->stackMemories);
  std::vector<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>::_M_move_assign
            (&this->currentStacks,&_Stack_28);
  std::_Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>::~_Vector_base
            (&_Stack_28);
  mark(this);
  compact(this);
  return;
}

Assistant:

void GarbageCollector::internalPerformCollection()
{
    if(disableCount > 0)
        return;

	// Get the current stacks
	currentStacks = memoryManager->getStackMemories()->getAll();

	// TODO: Suspend the other GC threads.
	mark();
	compact();
}